

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

void __thiscall kj::Arena::~Arena(Arena *this)

{
  UnwindDetector *this_00;
  Type *func;
  kj *this_01;
  UnwindDetector *local_40;
  Arena *local_38;
  undefined1 local_30 [8];
  Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_arena_c__:48:3)>
  _kjDefer48;
  UnwindDetector _kjUnwindDetector48;
  Arena *this_local;
  
  this_00 = (UnwindDetector *)((long)&_kjDefer48.maybeFunc.ptr.field_1 + 0xc);
  UnwindDetector::UnwindDetector(this_00);
  this_01 = (kj *)&local_40;
  local_40 = this_00;
  local_38 = this;
  defer<kj::Arena::~Arena()::__0>
            ((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_arena_c__:48:3)>
              *)local_30,this_01,func);
  cleanup(this,(EVP_PKEY_CTX *)this_01);
  kj::_::
  Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena.c++:48:3)>
  ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_arena_c__:48:3)>
               *)local_30);
  return;
}

Assistant:

Arena::~Arena() noexcept(false) {
  // Run cleanup() explicitly, but if it throws an exception, make sure to run it again as part of
  // unwind.  The second call will not throw because destructors are required to guard against
  // exceptions when already unwinding.
  KJ_ON_SCOPE_FAILURE(cleanup());
  cleanup();
}